

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  float fVar1;
  Point2f uv;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  Vector3f d;
  SampledSpectrum SVar8;
  
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar4 = auVar3._0_4_;
  fVar5 = auVar6._0_4_;
  fVar7 = auVar2._0_4_;
  fVar1 = fVar4 * fVar4 + fVar5 * fVar5 + fVar7 * fVar7;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
    auVar6 = ZEXT416((uint)fVar5);
    auVar3 = ZEXT416((uint)fVar4);
  }
  else {
    auVar2 = vsqrtss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
    fVar1 = auVar2._0_4_;
  }
  auVar2._0_4_ = auVar3._0_4_ / fVar1;
  auVar2._4_12_ = auVar3._4_12_;
  auVar3._0_4_ = auVar6._0_4_ / fVar1;
  auVar3._4_12_ = auVar6._4_12_;
  auVar3 = vinsertps_avx(auVar2,auVar3,0x10);
  d.super_Tuple3<pbrt::Vector3,_float>.z = fVar7 / fVar1;
  d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar3._0_8_;
  uv = EqualAreaSphereToSquare(d);
  SVar8 = Le(this,uv,lambda);
  return (array<float,_4>)(array<float,_4>)SVar8;
}

Assistant:

Le(const Ray &ray, const SampledWavelengths &lambda) const {
        Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
        Point2f uv = EqualAreaSphereToSquare(wl);
        return Le(uv, lambda);
    }